

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner-dump.c
# Opt level: O0

gboolean loudness_dump_parse(int *argc,char ***argv)

{
  gboolean gVar1;
  char ***argv_local;
  int *argc_local;
  
  if (decode_to_file != (gchar *)0x0) {
    fprintf(_stderr,"Cannot decode to file in dump mode\n");
    return 0;
  }
  gVar1 = parse_mode_args(argc,argv,entries);
  if (gVar1 != 0) {
    if (((char)((momentary != 0.0) + (shortterm != 0.0) + (integrated != 0.0)) == '\x01') &&
       (interval = momentary + shortterm + integrated, 0.0 < interval)) {
      if ((0.4 < momentary) || (3.0 < shortterm)) {
        fprintf(_stderr,"Warning: you may lose samples when specifying this interval!\n");
      }
      return 1;
    }
    fprintf(_stderr,"Exactly one of -m, -s and -i must be positive!\n");
    return 0;
  }
  if (*argc == 1) {
    fprintf(_stderr,"Missing arguments\n");
  }
  return 0;
}

Assistant:

gboolean
loudness_dump_parse(int *argc, char **argv[])
{
	if (decode_to_file) {
		fprintf(stderr, "Cannot decode to file in dump mode\n");
		return FALSE;
	}

	if (!parse_mode_args(argc, argv, entries)) {
		if (*argc == 1)
			fprintf(stderr, "Missing arguments\n");
		return FALSE;
	}

	if ((momentary != 0.0) + (shortterm != 0.0) + (integrated != 0.0) !=
		1 ||
	    (interval = momentary + shortterm + integrated) <= 0.0) {
		fprintf(stderr,
		    "Exactly one of -m, -s and -i must be positive!\n");
		return FALSE;
	}

	if (momentary > 0.4 || shortterm > 3.0) {
		fprintf(stderr,
		    "Warning: you may lose samples when specifying "
		    "this interval!\n");
	}
	return TRUE;
}